

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O3

void __thiscall QPicture::QPicture(QPicture *this,int formatVersion)

{
  QPicturePrivate *pQVar1;
  QPicture *this_00;
  
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPicture_007d24d0;
  pQVar1 = (QPicturePrivate *)operator_new(0xb8);
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  this_00 = (QPicture *)&pQVar1->pictb;
  QBuffer::QBuffer((QBuffer *)this_00,(QObject *)0x0);
  (pQVar1->brect).x1 = 0;
  (pQVar1->brect).y1 = 0;
  (pQVar1->brect).x2 = -1;
  (pQVar1->brect).y2 = -1;
  (pQVar1->override_rect).x1 = 0;
  (pQVar1->override_rect).y1 = 0;
  (pQVar1->override_rect).x2 = -1;
  (pQVar1->override_rect).y2 = -1;
  (pQVar1->paintEngine).d = (QPaintEngine *)0x0;
  pQVar1->in_memory_only = false;
  (pQVar1->image_list).d.d = (Data *)0x0;
  (pQVar1->image_list).d.ptr = (QImage *)0x0;
  (pQVar1->image_list).d.size = 0;
  (pQVar1->pixmap_list).d.d = (Data *)0x0;
  (pQVar1->pixmap_list).d.ptr = (QPixmap *)0x0;
  (pQVar1->pixmap_list).d.size = 0;
  (pQVar1->brush_list).d.d = (Data *)0x0;
  (pQVar1->brush_list).d.ptr = (QBrush *)0x0;
  (pQVar1->brush_list).d.size = 0;
  (pQVar1->pen_list).d.d = (Data *)0x0;
  (pQVar1->pen_list).d.ptr = (QPen *)0x0;
  (pQVar1->pen_list).d.size = 0;
  (this->d_ptr).d.ptr = pQVar1;
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = (this->d_ptr).d.ptr;
  if (formatVersion == 0) {
    QPicture(this_00);
  }
  else if (formatVersion != 0x17 && 0 < formatVersion) {
    pQVar1->formatMajor = formatVersion;
    pQVar1->formatMinor = 0;
    pQVar1->formatOk = false;
    return;
  }
  pQVar1->formatOk = false;
  pQVar1->formatMajor = 0x17;
  pQVar1->formatMinor = 0;
  return;
}

Assistant:

QPicture::QPicture(int formatVersion)
    : QPaintDevice(),
      d_ptr(new QPicturePrivate)
{
    Q_D(QPicture);

    if (formatVersion == 0)
        qWarning("QPicture: invalid format version 0");

    // still accept the 0 default from before Qt 3.0.
    if (formatVersion > 0 && formatVersion != (int)mfhdr_maj) {
        d->formatMajor = formatVersion;
        d->formatMinor = 0;
        d->formatOk = false;
    } else {
        d->resetFormat();
    }
}